

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O2

void __thiscall NaPolyFrac::Save(NaPolyFrac *this,NaDataStream *ds)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  char szBuf [1025];
  char local_438 [1032];
  
  uVar3 = 0;
  memset(local_438,0,0x401);
  while( true ) {
    uVar1 = NaVector::dim(&this->num);
    if (uVar1 <= uVar3) break;
    sVar2 = strlen(local_438);
    NaVector::operator()(&this->num,uVar3);
    sprintf(local_438 + sVar2," %g");
    uVar3 = uVar3 + 1;
  }
  sVar2 = strlen(local_438);
  builtin_strncpy(local_438 + sVar2," / ",4);
  uVar3 = 0;
  while( true ) {
    uVar1 = NaVector::dim(&this->den);
    if (uVar1 <= uVar3) break;
    sVar2 = strlen(local_438);
    NaVector::operator()(&this->den,uVar3);
    sprintf(local_438 + sVar2," %g");
    uVar3 = uVar3 + 1;
  }
  NaDataStream::PutF(ds,"num/den","%s",local_438);
  return;
}

Assistant:

void
NaPolyFrac::Save (NaDataStream& ds)
{
    unsigned    i;
    char        szBuf[MaxConfigFileLine+1] = "";

    // numerator
    for(i = 0; i < num.dim(); ++i){
        sprintf(szBuf + strlen(szBuf), " %g", num(i));
    }

    // delimiter
    strcat(szBuf, " / ");

    // denumerator
    for(i = 0; i < den.dim(); ++i){
        sprintf(szBuf + strlen(szBuf), " %g", den(i));
    }

    ds.PutF("num/den", "%s", szBuf);
}